

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_feature_tests.cpp
# Opt level: O0

void __thiscall iu_Optional_x_iutest_x_PrintTo_Test::Body(iu_Optional_x_iutest_x_PrintTo_Test *this)

{
  Fixed *pFVar1;
  optional<int> *v;
  optional<int> *v_00;
  AssertionHelper local_480;
  string local_450;
  Fixed local_430;
  optional<int> local_2a0;
  optional<int> opt_1;
  PrintToLogChecker ck_1;
  string local_220;
  Fixed local_1f0;
  int local_64;
  optional<int> local_60;
  optional<int> opt;
  PrintToLogChecker ck;
  iu_Optional_x_iutest_x_PrintTo_Test *this_local;
  
  PrintToLogChecker::PrintToLogChecker((PrintToLogChecker *)&opt,"1234");
  local_64 = 0x4d2;
  std::optional<int>::optional<int,_true>(&local_60,&local_64);
  memset(&local_1f0,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1f0);
  iutest::PrintToString<std::optional<int>>(&local_220,(iutest *)&local_60,v);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_1f0,&local_220);
  iutest::AssertionHelper::AssertionHelper
            ((AssertionHelper *)((long)&ck_1.printer_logger.m_log.field_2 + 8),
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
             ,0x65,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=
            ((AssertionHelper *)((long)&ck_1.printer_logger.m_log.field_2 + 8),pFVar1);
  iutest::AssertionHelper::~AssertionHelper
            ((AssertionHelper *)((long)&ck_1.printer_logger.m_log.field_2 + 8));
  std::__cxx11::string::~string((string *)&local_220);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1f0);
  PrintToLogChecker::~PrintToLogChecker((PrintToLogChecker *)&opt);
  PrintToLogChecker::PrintToLogChecker((PrintToLogChecker *)&opt_1,"nullopt");
  std::optional<int>::optional(&local_2a0);
  memset(&local_430,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_430);
  iutest::PrintToString<std::optional<int>>(&local_450,(iutest *)&local_2a0,v_00);
  pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_430,&local_450);
  iutest::AssertionHelper::AssertionHelper
            (&local_480,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/cxx_feature_tests.cpp"
             ,0x6a,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_480,pFVar1);
  iutest::AssertionHelper::~AssertionHelper(&local_480);
  std::__cxx11::string::~string((string *)&local_450);
  iutest::AssertionHelper::Fixed::~Fixed(&local_430);
  PrintToLogChecker::~PrintToLogChecker((PrintToLogChecker *)&opt_1);
  return;
}

Assistant:

IUTEST(Optional, PrintTo)
{
    {
        PrintToLogChecker ck("1234");
        ::std::optional<int> opt = 1234;
        IUTEST_SUCCEED() << ::iutest::PrintToString(opt);
    }
    {
        PrintToLogChecker ck("nullopt");
        ::std::optional<int> opt = ::std::nullopt;
        IUTEST_SUCCEED() << ::iutest::PrintToString(opt);
    }
}